

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

void __thiscall
cmLinkLineComputer::cmLinkLineComputer
          (cmLinkLineComputer *this,cmOutputConverter *outputConverter,cmStateDirectory *stateDir)

{
  PositionType PVar1;
  cmState *pcVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  
  this->_vptr_cmLinkLineComputer = (_func_int **)&PTR__cmLinkLineComputer_0094c6c0;
  PVar1 = (stateDir->DirectoryState).Position;
  pcVar2 = (stateDir->Snapshot_).State;
  pcVar3 = (stateDir->Snapshot_).Position.Tree;
  (this->StateDir).DirectoryState.Tree = (stateDir->DirectoryState).Tree;
  (this->StateDir).DirectoryState.Position = PVar1;
  (this->StateDir).Snapshot_.State = pcVar2;
  (this->StateDir).Snapshot_.Position.Tree = pcVar3;
  (this->StateDir).Snapshot_.Position.Position = (stateDir->Snapshot_).Position.Position;
  this->OutputConverter = outputConverter;
  this->ForResponse = false;
  this->UseWatcomQuote = false;
  this->UseNinjaMulti = false;
  this->Relink = false;
  return;
}

Assistant:

cmLinkLineComputer::cmLinkLineComputer(cmOutputConverter* outputConverter,
                                       cmStateDirectory const& stateDir)
  : StateDir(stateDir)
  , OutputConverter(outputConverter)
{
}